

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MAi_inform_base(Integer datatype,Pointer address1,Pointer address2)

{
  Boolean BVar1;
  
  if (ma_initialized == '\x01') {
    builtin_strncpy(ma_ebuf,"MA already initialized",0x17);
    ma_error(EL_Nonfatal,ET_Internal,"MAi_inform_base",ma_ebuf);
    BVar1 = 0;
  }
  else if (datatype - 1000U < 0x11) {
    *(Pointer *)(&DWORD_001ea120 + datatype * 2) = address1;
    *(int *)(datatype * 4 + 0x1eb150) = (int)address2 - (int)address1;
    BVar1 = 1;
  }
  else {
    BVar1 = 0;
    sprintf(ma_ebuf,"invalid datatype: %ld",datatype);
    ma_error(EL_Nonfatal,ET_Internal,"MAi_inform_base",ma_ebuf);
  }
  return BVar1;
}

Assistant:

public Boolean MAi_inform_base(datatype, address1, address2)
    Integer    datatype;    /* to set size of */
    Pointer    address1;    /* of datatype element base */
    Pointer    address2;    /* of an adjacent datatype element */
{
    /* verify uninitialization */
    if (ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA already initialized");
        ma_error(EL_Nonfatal, ET_Internal, "MAi_inform_base", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Nonfatal, ET_Internal, "MAi_inform_base", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* set the base address of datatype */
    ma_base[datatype] = address1;

    /* set the size of datatype */
    ma_sizeof[datatype] = (int)(address2 - address1);

    /* success */
    return MA_TRUE;
}